

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void SstFFSMarshal(SstStream Stream,void *Variable,char *Name,int Type,size_t ElemSize,
                  size_t DimCount,size_t *Shape,size_t *Count,size_t *Offsets,void *Data)

{
  int iVar1;
  size_t *psVar2;
  size_t *psVar3;
  size_t *psVar4;
  size_t *psVar5;
  size_t sVar6;
  void *pvVar7;
  undefined4 in_ECX;
  undefined8 in_RDX;
  char *in_RSI;
  SstStream in_RDI;
  size_t in_R8;
  size_t in_R9;
  SstStream unaff_retaddr;
  size_t ElemCount_1;
  size_t ElemCount;
  size_t PreviousDBCount;
  ArrayRec *DataEntry;
  MetaArrayRec *MetaEntry;
  int AlreadyWritten;
  FFSWriterRec Rec;
  FFSMetadataInfoStruct *MBase;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  FFSMetadataInfoStruct *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  FFSWriterRec local_40;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = (int)((ulong)in_RDX >> 0x20);
  local_40 = LookupWriterRec(in_RDI,in_RSI);
  if (local_40 == (FFSWriterRec)0x0) {
    local_40 = CreateWriterRec(unaff_retaddr,in_RDI,in_RSI,iVar1,
                               CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8);
  }
  iVar1 = FFSBitfieldTest(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  FFSBitfieldSet(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  if (local_40->DimCount == 0) {
    memcpy((void *)((long)in_RDI->M + local_40->MetaOffset),DataEntry,in_R8);
  }
  else {
    psVar2 = (size_t *)((long)in_RDI->M + local_40->MetaOffset);
    psVar3 = (size_t *)((long)in_RDI->D + local_40->DataOffset);
    *psVar2 = in_R9;
    if (iVar1 == 0) {
      if (ElemCount_1 == 0) {
        psVar2[2] = 0;
      }
      else {
        psVar4 = CopyDims((size_t)in_stack_ffffffffffffff90,
                          (size_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        psVar2[2] = (size_t)psVar4;
      }
      psVar2[1] = in_R9;
      psVar4 = CopyDims((size_t)in_stack_ffffffffffffff90,
                        (size_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      psVar2[3] = (size_t)psVar4;
      if (PreviousDBCount == 0) {
        psVar2[4] = 0;
      }
      else {
        psVar4 = CopyDims((size_t)in_stack_ffffffffffffff90,
                          (size_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        psVar2[4] = (size_t)psVar4;
      }
    }
    else {
      psVar4 = (size_t *)psVar2[1];
      psVar2[1] = in_R9 + psVar2[1];
      psVar5 = AppendDims(psVar4,in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                          (size_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      psVar2[3] = (size_t)psVar5;
      if (PreviousDBCount != 0) {
        psVar4 = AppendDims(psVar4,in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                            (size_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
        ;
        psVar2[4] = (size_t)psVar4;
      }
    }
    if (iVar1 == 0) {
      sVar6 = CalcSize(in_R9,(size_t *)ElemCount);
      *psVar3 = sVar6;
      pvVar7 = malloc(sVar6 * in_R8);
      psVar3[1] = (size_t)pvVar7;
      memcpy((void *)psVar3[1],DataEntry,sVar6 * in_R8);
    }
    else {
      sVar6 = CalcSize(in_R9,(size_t *)ElemCount);
      pvVar7 = realloc((void *)psVar3[1],(*psVar3 + sVar6) * in_R8);
      psVar3[1] = (size_t)pvVar7;
      memcpy((void *)(psVar3[1] + *psVar3 * in_R8),DataEntry,sVar6 * in_R8);
      *psVar3 = sVar6 + *psVar3;
    }
  }
  return;
}

Assistant:

extern void SstFFSMarshal(SstStream Stream, void *Variable, const char *Name, const int Type,
                          size_t ElemSize, size_t DimCount, const size_t *Shape,
                          const size_t *Count, const size_t *Offsets, const void *Data)
{

    struct FFSMetadataInfoStruct *MBase;

    FFSWriterRec Rec = LookupWriterRec(Stream, Variable);
    if (!Rec)
    {
        Rec = CreateWriterRec(Stream, Variable, Name, Type, ElemSize, DimCount);
    }

    MBase = Stream->M;
    int AlreadyWritten = FFSBitfieldTest(MBase, Rec->FieldID);
    FFSBitfieldSet(MBase, Rec->FieldID);

    if (Rec->DimCount == 0)
    {
        memcpy((char *)(Stream->M) + Rec->MetaOffset, Data, ElemSize);
    }
    else
    {
        MetaArrayRec *MetaEntry = (MetaArrayRec *)((char *)(Stream->M) + Rec->MetaOffset);
        ArrayRec *DataEntry = (ArrayRec *)((char *)(Stream->D) + Rec->DataOffset);

        /* handle metadata */
        MetaEntry->Dims = DimCount;
        if (!AlreadyWritten)
        {
            if (Shape)
                MetaEntry->Shape = CopyDims(DimCount, Shape);
            else
                MetaEntry->Shape = NULL;
            MetaEntry->DBCount = DimCount;
            MetaEntry->Count = CopyDims(DimCount, Count);
            if (Offsets)
                MetaEntry->Offsets = CopyDims(DimCount, Offsets);
            else
                MetaEntry->Offsets = NULL;
        }
        else
        {
            /* already got some metadata, add blocks */
            size_t PreviousDBCount = MetaEntry->DBCount;
            //  Assume shape is still valid   (modify this if shape /global
            //  dimensions can change )
            // Also assume Dims is always right and consistent, otherwise, bad
            // things
            MetaEntry->DBCount += DimCount;
            MetaEntry->Count = AppendDims(MetaEntry->Count, PreviousDBCount, DimCount, Count);
            if (Offsets)
                MetaEntry->Offsets =
                    AppendDims(MetaEntry->Offsets, PreviousDBCount, DimCount, Offsets);
        }

        if ((Stream->ConfigParams->CompressionMethod == SstCompressZFP) &&
            ZFPcompressionPossible(Type, DimCount))
        {
#ifdef ADIOS2_HAVE_ZFP
            /* this should never be true if ZFP is not available */
            size_t ByteCount;
            char *Output =
                FFS_ZFPCompress(Stream, Rec->DimCount, Rec->Type, (void *)Data, Count, &ByteCount);
            DataEntry->ElemCount = ByteCount;
            DataEntry->Array = Output;
#endif
        }
        else
        {
            if (!AlreadyWritten)
            {
                /* normal array case */
                size_t ElemCount = CalcSize(DimCount, Count);
                DataEntry->ElemCount = ElemCount;
                /* this is PutSync case, so we have to copy the data NOW */
                DataEntry->Array = malloc(ElemCount * ElemSize);
                memcpy(DataEntry->Array, Data, ElemCount * ElemSize);
            }
            else
            {
                size_t ElemCount = CalcSize(DimCount, Count);
                /* this is PutSync case, so we have to copy the data NOW */
                DataEntry->Array =
                    realloc(DataEntry->Array, (DataEntry->ElemCount + ElemCount) * ElemSize);
                memcpy((char *)DataEntry->Array + DataEntry->ElemCount * ElemSize, Data,
                       ElemCount * ElemSize);
                DataEntry->ElemCount += ElemCount;
            }
        }
    }
}